

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O0

char * Abc_NodeConvertSopToMvSop(int nVars,Vec_Int_t *vSop0,Vec_Int_t *vSop1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  int local_50;
  int local_4c;
  int k;
  int i;
  int Value;
  int nSize;
  int nCubes;
  uint uCube;
  char *pCur;
  char *pMvSop;
  Vec_Int_t *vSop1_local;
  Vec_Int_t *vSop0_local;
  char *pcStack_10;
  int nVars_local;
  
  iVar1 = Vec_IntSize(vSop0);
  if ((iVar1 == 0) || (iVar1 = Vec_IntSize(vSop1), iVar1 == 0)) {
    pcStack_10 = (char *)malloc((long)(nVars + 3));
    for (local_50 = 0; local_50 < nVars; local_50 = local_50 + 1) {
      pcStack_10[local_50] = '-';
    }
    iVar1 = Vec_IntSize(vSop1);
    pcStack_10[nVars] = (0 < iVar1) + '0';
    pcStack_10[nVars + 1] = '\n';
    pcStack_10[nVars + 2] = '\0';
  }
  else {
    iVar1 = Vec_IntSize(vSop0);
    iVar2 = Vec_IntSize(vSop1);
    iVar1 = (iVar1 + iVar2) * (nVars + 2) + 1;
    pcStack_10 = (char *)malloc((long)iVar1);
    _nCubes = pcStack_10;
    for (local_4c = 0; iVar2 = Vec_IntSize(vSop0), local_4c < iVar2; local_4c = local_4c + 1) {
      uVar3 = Vec_IntEntry(vSop0,local_4c);
      for (local_50 = 0; local_50 < nVars; local_50 = local_50 + 1) {
        uVar4 = uVar3 >> ((byte)(local_50 << 1) & 0x1f) & 3;
        if (uVar4 == 1) {
          *_nCubes = '0';
        }
        else if (uVar4 == 2) {
          *_nCubes = '1';
        }
        else {
          if (uVar4 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                          ,0x42f,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)");
          }
          *_nCubes = '-';
        }
        _nCubes = _nCubes + 1;
      }
      pcVar5 = _nCubes + 1;
      *_nCubes = '0';
      _nCubes = _nCubes + 2;
      *pcVar5 = '\n';
    }
    for (local_4c = 0; iVar2 = Vec_IntSize(vSop1), local_4c < iVar2; local_4c = local_4c + 1) {
      uVar3 = Vec_IntEntry(vSop1,local_4c);
      for (local_50 = 0; local_50 < nVars; local_50 = local_50 + 1) {
        uVar4 = uVar3 >> ((byte)(local_50 << 1) & 0x1f) & 3;
        if (uVar4 == 1) {
          *_nCubes = '0';
        }
        else if (uVar4 == 2) {
          *_nCubes = '1';
        }
        else {
          if (uVar4 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                          ,0x441,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)");
          }
          *_nCubes = '-';
        }
        _nCubes = _nCubes + 1;
      }
      pcVar5 = _nCubes + 1;
      *_nCubes = '1';
      _nCubes = _nCubes + 2;
      *pcVar5 = '\n';
    }
    *_nCubes = '\0';
    if (_nCubes + (1 - (long)pcStack_10) != (char *)(long)iVar1) {
      __assert_fail("pCur - pMvSop == nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x447,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)");
    }
  }
  return pcStack_10;
}

Assistant:

char * Abc_NodeConvertSopToMvSop( int nVars, Vec_Int_t * vSop0, Vec_Int_t * vSop1 )
{
    char * pMvSop, * pCur;
    unsigned uCube;
    int nCubes, nSize, Value, i, k;
    // consider the case of the constant node
    if ( Vec_IntSize(vSop0) == 0 || Vec_IntSize(vSop1) == 0 )
    {
        // (temporary) create a tautology cube
        pMvSop = ABC_ALLOC( char, nVars + 3 );
        for ( k = 0; k < nVars; k++ )
            pMvSop[k] = '-';
        pMvSop[nVars] = '0' + (int)(Vec_IntSize(vSop1) > 0);
        pMvSop[nVars+1] = '\n';
        pMvSop[nVars+2] = 0;
        return pMvSop;
    }
    // find the total number of cubes
    nCubes = Vec_IntSize(vSop0) + Vec_IntSize(vSop1);
    // find the size of the MVSOP represented as a C-string
    // (each cube has nVars variables + one output literal + end-of-line,
    // and the string is zero-terminated)
    nSize = nCubes * (nVars + 2) + 1; 
    // allocate memory
    pMvSop = pCur = ABC_ALLOC( char, nSize );
    // fill in the negative polarity cubes
    Vec_IntForEachEntry( vSop0, uCube, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Value = (uCube >> (2*k)) & 3;
            if ( Value == 1 )
                *pCur++ = '0';
            else if ( Value == 2 )
                *pCur++ = '1';
            else if ( Value == 0 )
                *pCur++ = '-';
            else
                assert( 0 );
        }
        *pCur++ = '0';
        *pCur++ = '\n';
    }
    // fill in the positive polarity cubes
    Vec_IntForEachEntry( vSop1, uCube, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Value = (uCube >> (2*k)) & 3;
            if ( Value == 1 )
                *pCur++ = '0';
            else if ( Value == 2 )
                *pCur++ = '1';
            else if ( Value == 0 )
                *pCur++ = '-';
            else
                assert( 0 );
        }
        *pCur++ = '1';
        *pCur++ = '\n';
    }
    *pCur++ = 0;
    assert( pCur - pMvSop == nSize );
    return pMvSop;
}